

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

TValue * lj_tab_set(lua_State *L,GCtab *t,cTValue *key)

{
  double dVar1;
  int iVar2;
  TValue *pTVar3;
  uint uVar4;
  
  t->nomm = '\0';
  uVar4 = (key->field_2).it;
  if (uVar4 == 0xfffffffb) {
    pTVar3 = lj_tab_setstr(L,t,(GCstr *)(ulong)(key->u32).lo);
    return pTVar3;
  }
  if (uVar4 < 0xfffeffff) {
    dVar1 = key->n;
    if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
      uVar4 = (uint)dVar1;
      if (uVar4 < t->asize) {
        return (TValue *)((ulong)(t->array).ptr32 + (long)(int)uVar4 * 8);
      }
      pTVar3 = lj_tab_setinth(L,t,uVar4);
      return pTVar3;
    }
    if (NAN(dVar1)) {
      lj_err_msg(L,LJ_ERR_NANIDX);
    }
  }
  else if (uVar4 == 0xffffffff) {
    lj_err_msg(L,LJ_ERR_NILIDX);
  }
  pTVar3 = &hashkey(t,key)->val;
  do {
    iVar2 = lj_obj_equal(pTVar3 + 1,key);
    if (iVar2 != 0) {
      return pTVar3;
    }
    pTVar3 = (TValue *)(ulong)pTVar3[2].u32.lo;
  } while (pTVar3 != (TValue *)0x0);
  pTVar3 = lj_tab_newkey(L,t,key);
  return pTVar3;
}

Assistant:

TValue *lj_tab_set(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n;
  t->nomm = 0;  /* Invalidate negative metamethod cache. */
  if (tvisstr(key)) {
    return lj_tab_setstr(L, t, strV(key));
  } else if (tvisint(key)) {
    return lj_tab_setint(L, t, intV(key));
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k)
      return lj_tab_setint(L, t, k);
    if (tvisnan(key))
      lj_err_msg(L, LJ_ERR_NANIDX);
    /* Else use the generic lookup. */
  } else if (tvisnil(key)) {
    lj_err_msg(L, LJ_ERR_NILIDX);
  }
  n = hashkey(t, key);
  do {
    if (lj_obj_equal(&n->key, key))
      return &n->val;
  } while ((n = nextnode(n)));
  return lj_tab_newkey(L, t, key);
}